

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_timestep_embedding(ggml_context *ctx,ggml_tensor *timesteps,int dim,int max_period)

{
  ggml_tensor *tensor;
  int32_t in_ECX;
  int32_t in_EDX;
  ggml_tensor *in_RSI;
  undefined8 in_RDI;
  ggml_tensor *result;
  int actual_dim;
  
  tensor = ggml_new_tensor_2d((ggml_context *)result,(ggml_type)((ulong)in_RDI >> 0x20),
                              (int64_t)in_RSI,CONCAT44(in_EDX,in_ECX));
  ggml_set_op_params_i32(tensor,0,in_EDX);
  ggml_set_op_params_i32(tensor,1,in_ECX);
  tensor->op = GGML_OP_TIMESTEP_EMBEDDING;
  tensor->src[0] = in_RSI;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_timestep_embedding(
        struct ggml_context * ctx,
        struct ggml_tensor  * timesteps,
        int                   dim,
        int                   max_period) {
    int actual_dim = dim;
    if (dim % 2 != 0) {
        actual_dim = dim + 1;
    }

    struct ggml_tensor * result = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, actual_dim, timesteps->ne[0]);

    ggml_set_op_params_i32(result, 0, dim);
    ggml_set_op_params_i32(result, 1, max_period);

    result->op     = GGML_OP_TIMESTEP_EMBEDDING;
    result->src[0] = timesteps;

    return result;
}